

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp_session.cpp
# Opt level: O0

void __thiscall fineftp::FtpSession::handleFtpCommand(FtpSession *this,string *command)

{
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>
  *this_00;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>
  __l;
  bool bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  pointer ppVar5;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  *local_1248;
  enable_shared_from_this<fineftp::FtpSession> local_1100;
  wrapped_handler<asio::io_context::strand,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_continental[P]fineftp_server_fineftp_server_src_ftp_session_cpp:217:34),_asio::detail::is_continuation_if_running>
  local_10f0;
  allocator local_10c9;
  string local_10c8 [32];
  string local_10a8 [32];
  _Self local_1088;
  _Self local_1080;
  const_iterator command_it;
  FtpSession *local_1070;
  code *local_1068;
  undefined8 local_1060;
  type local_1058;
  FtpSession *local_1040;
  code *local_1038;
  undefined8 local_1030;
  type local_1028;
  FtpSession *local_1010;
  code *local_1008;
  undefined8 local_1000;
  type local_ff8;
  FtpSession *local_fe0;
  code *local_fd8;
  undefined8 local_fd0;
  type local_fc8;
  FtpSession *local_fb0;
  code *local_fa8;
  undefined8 local_fa0;
  type local_f98;
  FtpSession *local_f80;
  code *local_f78;
  undefined8 local_f70;
  type local_f68;
  FtpSession *local_f50;
  code *local_f48;
  undefined8 local_f40;
  type local_f38;
  FtpSession *local_f20;
  code *local_f18;
  undefined8 local_f10;
  type local_f08;
  FtpSession *local_ef0;
  code *local_ee8;
  undefined8 local_ee0;
  type local_ed8;
  FtpSession *local_ec0;
  code *local_eb8;
  undefined8 local_eb0;
  type local_ea8;
  FtpSession *local_e90;
  code *local_e88;
  undefined8 local_e80;
  type local_e78;
  FtpSession *local_e60;
  code *local_e58;
  undefined8 local_e50;
  type local_e48;
  FtpSession *local_e30;
  code *local_e28;
  undefined8 local_e20;
  type local_e18;
  FtpSession *local_e00;
  code *local_df8;
  undefined8 local_df0;
  type local_de8;
  FtpSession *local_dd0;
  code *local_dc8;
  undefined8 local_dc0;
  type local_db8;
  FtpSession *local_da0;
  code *local_d98;
  undefined8 local_d90;
  type local_d88;
  FtpSession *local_d70;
  code *local_d68;
  undefined8 local_d60;
  type local_d58;
  FtpSession *local_d40;
  code *local_d38;
  undefined8 local_d30;
  type local_d28;
  FtpSession *local_d10;
  code *local_d08;
  undefined8 local_d00;
  type local_cf8;
  FtpSession *local_ce0;
  code *local_cd8;
  undefined8 local_cd0;
  type local_cc8;
  FtpSession *local_cb0;
  code *local_ca8;
  undefined8 local_ca0;
  type local_c98;
  FtpSession *local_c80;
  code *local_c78;
  undefined8 local_c70;
  type local_c68;
  FtpSession *local_c50;
  code *local_c48;
  undefined8 local_c40;
  type local_c38;
  FtpSession *local_c20;
  code *local_c18;
  undefined8 local_c10;
  type local_c08;
  FtpSession *local_bf0;
  code *local_be8;
  undefined8 local_be0;
  type local_bd8;
  FtpSession *local_bc0;
  code *local_bb8;
  undefined8 local_bb0;
  type local_ba8;
  FtpSession *local_b90;
  code *local_b88;
  undefined8 local_b80;
  type local_b78;
  FtpSession *local_b60;
  code *local_b58;
  undefined8 local_b50;
  type local_b48;
  FtpSession *local_b30;
  code *local_b28;
  undefined8 local_b20;
  type local_b18;
  FtpSession *local_b00;
  code *local_af8;
  undefined8 local_af0;
  type local_ae8;
  FtpSession *local_ad0;
  code *local_ac8;
  undefined8 local_ac0;
  type local_ab8;
  FtpSession *local_aa0;
  code *local_a98;
  undefined8 local_a90;
  type local_a88;
  FtpSession *local_a70;
  code *local_a68;
  undefined8 local_a60;
  type local_a58;
  FtpSession *local_a40;
  code *local_a38;
  undefined8 local_a30;
  type local_a28;
  FtpSession *local_a10;
  code *local_a08;
  undefined8 local_a00;
  type local_9f8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  *local_9e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_9d8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_998;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_958;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_918;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_8d8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_898;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_858;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_818;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_7d8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_798;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_758;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_718;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_6d8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_698;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_658;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_618;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_5d8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_598;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_558;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_518;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_4d8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_498;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_458;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_418;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_3d8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_398;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_358;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_318;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_2d8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_298;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_258;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_218;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_1d8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_198;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_158;
  iterator local_118;
  size_type local_110;
  undefined1 local_108 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>_>
  command_map;
  string local_80 [32];
  long local_60;
  size_t space_index;
  string parameters;
  string local_38 [8];
  string ftp_command;
  string *command_local;
  FtpSession *this_local;
  
  ::std::__cxx11::string::string(local_38);
  ::std::__cxx11::string::string((string *)&space_index);
  local_60 = ::std::__cxx11::string::find_first_of((char)command,0x20);
  ::std::__cxx11::string::substr((ulong)local_80,(ulong)command);
  ::std::__cxx11::string::operator=(local_38,local_80);
  ::std::__cxx11::string::~string(local_80);
  uVar2 = ::std::__cxx11::string::begin();
  uVar3 = ::std::__cxx11::string::end();
  uVar4 = ::std::__cxx11::string::begin();
  ::std::
  transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,fineftp::FtpSession::handleFtpCommand(std::__cxx11::string_const&)::__0>
            (uVar2,uVar3,uVar4);
  if (local_60 != -1) {
    ::std::__cxx11::string::substr
              ((ulong)&command_map._M_t._M_impl.super__Rb_tree_header._M_node_count,(ulong)command);
    ::std::__cxx11::string::operator=
              ((string *)&space_index,
               (string *)&command_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
    ::std::__cxx11::string::~string
              ((string *)&command_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  local_9e0 = &local_9d8;
  local_a08 = handleFtpCommandUSER;
  local_a00 = 0;
  local_a10 = this;
  ::std::
  bind<void(fineftp::FtpSession::*)(std::__cxx11::string_const&),fineftp::FtpSession*,std::_Placeholder<1>const&>
            (&local_9f8,(offset_in_FtpSession_to_subr *)&local_a08,&local_a10,
             (_Placeholder<1> *)&::std::placeholders::_1);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_9d8,(char (*) [5])"USER",&local_9f8);
  local_a38 = handleFtpCommandPASS;
  local_a30 = 0;
  local_a40 = this;
  local_9e0 = &local_998;
  ::std::
  bind<void(fineftp::FtpSession::*)(std::__cxx11::string_const&),fineftp::FtpSession*,std::_Placeholder<1>const&>
            (&local_a28,(offset_in_FtpSession_to_subr *)&local_a38,&local_a40,
             (_Placeholder<1> *)&::std::placeholders::_1);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_998,(char (*) [5])"PASS",&local_a28);
  local_a68 = handleFtpCommandACCT;
  local_a60 = 0;
  local_a70 = this;
  local_9e0 = &local_958;
  ::std::
  bind<void(fineftp::FtpSession::*)(std::__cxx11::string_const&),fineftp::FtpSession*,std::_Placeholder<1>const&>
            (&local_a58,(offset_in_FtpSession_to_subr *)&local_a68,&local_a70,
             (_Placeholder<1> *)&::std::placeholders::_1);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_958,(char (*) [5])"ACCT",&local_a58);
  local_a98 = handleFtpCommandCWD;
  local_a90 = 0;
  local_aa0 = this;
  local_9e0 = &local_918;
  ::std::
  bind<void(fineftp::FtpSession::*)(std::__cxx11::string_const&),fineftp::FtpSession*,std::_Placeholder<1>const&>
            (&local_a88,(offset_in_FtpSession_to_subr *)&local_a98,&local_aa0,
             (_Placeholder<1> *)&::std::placeholders::_1);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[4],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_918,(char (*) [4])"CWD",&local_a88);
  local_ac8 = handleFtpCommandCDUP;
  local_ac0 = 0;
  local_ad0 = this;
  local_9e0 = &local_8d8;
  ::std::
  bind<void(fineftp::FtpSession::*)(std::__cxx11::string_const&),fineftp::FtpSession*,std::_Placeholder<1>const&>
            (&local_ab8,(offset_in_FtpSession_to_subr *)&local_ac8,&local_ad0,
             (_Placeholder<1> *)&::std::placeholders::_1);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_8d8,(char (*) [5])"CDUP",&local_ab8);
  local_af8 = handleFtpCommandREIN;
  local_af0 = 0;
  local_b00 = this;
  local_9e0 = &local_898;
  ::std::
  bind<void(fineftp::FtpSession::*)(std::__cxx11::string_const&),fineftp::FtpSession*,std::_Placeholder<1>const&>
            (&local_ae8,(offset_in_FtpSession_to_subr *)&local_af8,&local_b00,
             (_Placeholder<1> *)&::std::placeholders::_1);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_898,(char (*) [5])"REIN",&local_ae8);
  local_b28 = handleFtpCommandQUIT;
  local_b20 = 0;
  local_b30 = this;
  local_9e0 = &local_858;
  ::std::
  bind<void(fineftp::FtpSession::*)(std::__cxx11::string_const&),fineftp::FtpSession*,std::_Placeholder<1>const&>
            (&local_b18,(offset_in_FtpSession_to_subr *)&local_b28,&local_b30,
             (_Placeholder<1> *)&::std::placeholders::_1);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_858,(char (*) [5])"QUIT",&local_b18);
  local_b58 = handleFtpCommandPORT;
  local_b50 = 0;
  local_b60 = this;
  local_9e0 = &local_818;
  ::std::
  bind<void(fineftp::FtpSession::*)(std::__cxx11::string_const&),fineftp::FtpSession*,std::_Placeholder<1>const&>
            (&local_b48,(offset_in_FtpSession_to_subr *)&local_b58,&local_b60,
             (_Placeholder<1> *)&::std::placeholders::_1);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_818,(char (*) [5])"PORT",&local_b48);
  local_b88 = handleFtpCommandPASV;
  local_b80 = 0;
  local_b90 = this;
  local_9e0 = &local_7d8;
  ::std::
  bind<void(fineftp::FtpSession::*)(std::__cxx11::string_const&),fineftp::FtpSession*,std::_Placeholder<1>const&>
            (&local_b78,(offset_in_FtpSession_to_subr *)&local_b88,&local_b90,
             (_Placeholder<1> *)&::std::placeholders::_1);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_7d8,(char (*) [5])"PASV",&local_b78);
  local_bb8 = handleFtpCommandTYPE;
  local_bb0 = 0;
  local_bc0 = this;
  local_9e0 = &local_798;
  ::std::
  bind<void(fineftp::FtpSession::*)(std::__cxx11::string_const&),fineftp::FtpSession*,std::_Placeholder<1>const&>
            (&local_ba8,(offset_in_FtpSession_to_subr *)&local_bb8,&local_bc0,
             (_Placeholder<1> *)&::std::placeholders::_1);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_798,(char (*) [5])"TYPE",&local_ba8);
  local_be8 = handleFtpCommandSTRU;
  local_be0 = 0;
  local_bf0 = this;
  local_9e0 = &local_758;
  ::std::
  bind<void(fineftp::FtpSession::*)(std::__cxx11::string_const&),fineftp::FtpSession*,std::_Placeholder<1>const&>
            (&local_bd8,(offset_in_FtpSession_to_subr *)&local_be8,&local_bf0,
             (_Placeholder<1> *)&::std::placeholders::_1);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_758,(char (*) [5])"STRU",&local_bd8);
  local_c18 = handleFtpCommandMODE;
  local_c10 = 0;
  local_c20 = this;
  local_9e0 = &local_718;
  ::std::
  bind<void(fineftp::FtpSession::*)(std::__cxx11::string_const&),fineftp::FtpSession*,std::_Placeholder<1>const&>
            (&local_c08,(offset_in_FtpSession_to_subr *)&local_c18,&local_c20,
             (_Placeholder<1> *)&::std::placeholders::_1);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_718,(char (*) [5])"MODE",&local_c08);
  local_c48 = handleFtpCommandRETR;
  local_c40 = 0;
  local_c50 = this;
  local_9e0 = &local_6d8;
  ::std::
  bind<void(fineftp::FtpSession::*)(std::__cxx11::string_const&),fineftp::FtpSession*,std::_Placeholder<1>const&>
            (&local_c38,(offset_in_FtpSession_to_subr *)&local_c48,&local_c50,
             (_Placeholder<1> *)&::std::placeholders::_1);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_6d8,(char (*) [5])"RETR",&local_c38);
  local_c78 = handleFtpCommandSTOR;
  local_c70 = 0;
  local_c80 = this;
  local_9e0 = &local_698;
  ::std::
  bind<void(fineftp::FtpSession::*)(std::__cxx11::string_const&),fineftp::FtpSession*,std::_Placeholder<1>const&>
            (&local_c68,(offset_in_FtpSession_to_subr *)&local_c78,&local_c80,
             (_Placeholder<1> *)&::std::placeholders::_1);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_698,(char (*) [5])"STOR",&local_c68);
  local_ca8 = handleFtpCommandSTOU;
  local_ca0 = 0;
  local_cb0 = this;
  local_9e0 = &local_658;
  ::std::
  bind<void(fineftp::FtpSession::*)(std::__cxx11::string_const&),fineftp::FtpSession*,std::_Placeholder<1>const&>
            (&local_c98,(offset_in_FtpSession_to_subr *)&local_ca8,&local_cb0,
             (_Placeholder<1> *)&::std::placeholders::_1);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_658,(char (*) [5])"STOU",&local_c98);
  local_cd8 = handleFtpCommandAPPE;
  local_cd0 = 0;
  local_ce0 = this;
  local_9e0 = &local_618;
  ::std::
  bind<void(fineftp::FtpSession::*)(std::__cxx11::string_const&),fineftp::FtpSession*,std::_Placeholder<1>const&>
            (&local_cc8,(offset_in_FtpSession_to_subr *)&local_cd8,&local_ce0,
             (_Placeholder<1> *)&::std::placeholders::_1);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_618,(char (*) [5])"APPE",&local_cc8);
  local_d08 = handleFtpCommandALLO;
  local_d00 = 0;
  local_d10 = this;
  local_9e0 = &local_5d8;
  ::std::
  bind<void(fineftp::FtpSession::*)(std::__cxx11::string_const&),fineftp::FtpSession*,std::_Placeholder<1>const&>
            (&local_cf8,(offset_in_FtpSession_to_subr *)&local_d08,&local_d10,
             (_Placeholder<1> *)&::std::placeholders::_1);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_5d8,(char (*) [5])"ALLO",&local_cf8);
  local_d38 = handleFtpCommandREST;
  local_d30 = 0;
  local_d40 = this;
  local_9e0 = &local_598;
  ::std::
  bind<void(fineftp::FtpSession::*)(std::__cxx11::string_const&),fineftp::FtpSession*,std::_Placeholder<1>const&>
            (&local_d28,(offset_in_FtpSession_to_subr *)&local_d38,&local_d40,
             (_Placeholder<1> *)&::std::placeholders::_1);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_598,(char (*) [5])"REST",&local_d28);
  local_d68 = handleFtpCommandRNFR;
  local_d60 = 0;
  local_d70 = this;
  local_9e0 = &local_558;
  ::std::
  bind<void(fineftp::FtpSession::*)(std::__cxx11::string_const&),fineftp::FtpSession*,std::_Placeholder<1>const&>
            (&local_d58,(offset_in_FtpSession_to_subr *)&local_d68,&local_d70,
             (_Placeholder<1> *)&::std::placeholders::_1);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_558,(char (*) [5])"RNFR",&local_d58);
  local_d98 = handleFtpCommandRNTO;
  local_d90 = 0;
  local_da0 = this;
  local_9e0 = &local_518;
  ::std::
  bind<void(fineftp::FtpSession::*)(std::__cxx11::string_const&),fineftp::FtpSession*,std::_Placeholder<1>const&>
            (&local_d88,(offset_in_FtpSession_to_subr *)&local_d98,&local_da0,
             (_Placeholder<1> *)&::std::placeholders::_1);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_518,(char (*) [5])"RNTO",&local_d88);
  local_dc8 = handleFtpCommandABOR;
  local_dc0 = 0;
  local_dd0 = this;
  local_9e0 = &local_4d8;
  ::std::
  bind<void(fineftp::FtpSession::*)(std::__cxx11::string_const&),fineftp::FtpSession*,std::_Placeholder<1>const&>
            (&local_db8,(offset_in_FtpSession_to_subr *)&local_dc8,&local_dd0,
             (_Placeholder<1> *)&::std::placeholders::_1);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_4d8,(char (*) [5])"ABOR",&local_db8);
  local_df8 = handleFtpCommandDELE;
  local_df0 = 0;
  local_e00 = this;
  local_9e0 = &local_498;
  ::std::
  bind<void(fineftp::FtpSession::*)(std::__cxx11::string_const&),fineftp::FtpSession*,std::_Placeholder<1>const&>
            (&local_de8,(offset_in_FtpSession_to_subr *)&local_df8,&local_e00,
             (_Placeholder<1> *)&::std::placeholders::_1);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_498,(char (*) [5])"DELE",&local_de8);
  local_e28 = handleFtpCommandRMD;
  local_e20 = 0;
  local_e30 = this;
  local_9e0 = &local_458;
  ::std::
  bind<void(fineftp::FtpSession::*)(std::__cxx11::string_const&),fineftp::FtpSession*,std::_Placeholder<1>const&>
            (&local_e18,(offset_in_FtpSession_to_subr *)&local_e28,&local_e30,
             (_Placeholder<1> *)&::std::placeholders::_1);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[4],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_458,(char (*) [4])"RMD",&local_e18);
  local_e58 = handleFtpCommandMKD;
  local_e50 = 0;
  local_e60 = this;
  local_9e0 = &local_418;
  ::std::
  bind<void(fineftp::FtpSession::*)(std::__cxx11::string_const&),fineftp::FtpSession*,std::_Placeholder<1>const&>
            (&local_e48,(offset_in_FtpSession_to_subr *)&local_e58,&local_e60,
             (_Placeholder<1> *)&::std::placeholders::_1);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[4],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_418,(char (*) [4])"MKD",&local_e48);
  local_e88 = handleFtpCommandPWD;
  local_e80 = 0;
  local_e90 = this;
  local_9e0 = &local_3d8;
  ::std::
  bind<void(fineftp::FtpSession::*)(std::__cxx11::string_const&),fineftp::FtpSession*,std::_Placeholder<1>const&>
            (&local_e78,(offset_in_FtpSession_to_subr *)&local_e88,&local_e90,
             (_Placeholder<1> *)&::std::placeholders::_1);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[4],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_3d8,(char (*) [4])"PWD",&local_e78);
  local_eb8 = handleFtpCommandLIST;
  local_eb0 = 0;
  local_ec0 = this;
  local_9e0 = &local_398;
  ::std::
  bind<void(fineftp::FtpSession::*)(std::__cxx11::string_const&),fineftp::FtpSession*,std::_Placeholder<1>const&>
            (&local_ea8,(offset_in_FtpSession_to_subr *)&local_eb8,&local_ec0,
             (_Placeholder<1> *)&::std::placeholders::_1);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_398,(char (*) [5])"LIST",&local_ea8);
  local_ee8 = handleFtpCommandNLST;
  local_ee0 = 0;
  local_ef0 = this;
  local_9e0 = &local_358;
  ::std::
  bind<void(fineftp::FtpSession::*)(std::__cxx11::string_const&),fineftp::FtpSession*,std::_Placeholder<1>const&>
            (&local_ed8,(offset_in_FtpSession_to_subr *)&local_ee8,&local_ef0,
             (_Placeholder<1> *)&::std::placeholders::_1);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_358,(char (*) [5])"NLST",&local_ed8);
  local_f18 = handleFtpCommandSITE;
  local_f10 = 0;
  local_f20 = this;
  local_9e0 = &local_318;
  ::std::
  bind<void(fineftp::FtpSession::*)(std::__cxx11::string_const&),fineftp::FtpSession*,std::_Placeholder<1>const&>
            (&local_f08,(offset_in_FtpSession_to_subr *)&local_f18,&local_f20,
             (_Placeholder<1> *)&::std::placeholders::_1);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_318,(char (*) [5])"SITE",&local_f08);
  local_f48 = handleFtpCommandSYST;
  local_f40 = 0;
  local_f50 = this;
  local_9e0 = &local_2d8;
  ::std::
  bind<void(fineftp::FtpSession::*)(std::__cxx11::string_const&),fineftp::FtpSession*,std::_Placeholder<1>const&>
            (&local_f38,(offset_in_FtpSession_to_subr *)&local_f48,&local_f50,
             (_Placeholder<1> *)&::std::placeholders::_1);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_2d8,(char (*) [5])"SYST",&local_f38);
  local_f78 = handleFtpCommandSTAT;
  local_f70 = 0;
  local_f80 = this;
  local_9e0 = &local_298;
  ::std::
  bind<void(fineftp::FtpSession::*)(std::__cxx11::string_const&),fineftp::FtpSession*,std::_Placeholder<1>const&>
            (&local_f68,(offset_in_FtpSession_to_subr *)&local_f78,&local_f80,
             (_Placeholder<1> *)&::std::placeholders::_1);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_298,(char (*) [5])"STAT",&local_f68);
  local_fa8 = handleFtpCommandHELP;
  local_fa0 = 0;
  local_fb0 = this;
  local_9e0 = &local_258;
  ::std::
  bind<void(fineftp::FtpSession::*)(std::__cxx11::string_const&),fineftp::FtpSession*,std::_Placeholder<1>const&>
            (&local_f98,(offset_in_FtpSession_to_subr *)&local_fa8,&local_fb0,
             (_Placeholder<1> *)&::std::placeholders::_1);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_258,(char (*) [5])"HELP",&local_f98);
  local_fd8 = handleFtpCommandNOOP;
  local_fd0 = 0;
  local_fe0 = this;
  local_9e0 = &local_218;
  ::std::
  bind<void(fineftp::FtpSession::*)(std::__cxx11::string_const&),fineftp::FtpSession*,std::_Placeholder<1>const&>
            (&local_fc8,(offset_in_FtpSession_to_subr *)&local_fd8,&local_fe0,
             (_Placeholder<1> *)&::std::placeholders::_1);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_218,(char (*) [5])"NOOP",&local_fc8);
  local_1008 = handleFtpCommandFEAT;
  local_1000 = 0;
  local_1010 = this;
  local_9e0 = &local_1d8;
  ::std::
  bind<void(fineftp::FtpSession::*)(std::__cxx11::string_const&),fineftp::FtpSession*,std::_Placeholder<1>const&>
            (&local_ff8,(offset_in_FtpSession_to_subr *)&local_1008,&local_1010,
             (_Placeholder<1> *)&::std::placeholders::_1);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_1d8,(char (*) [5])"FEAT",&local_ff8);
  local_1038 = handleFtpCommandOPTS;
  local_1030 = 0;
  local_1040 = this;
  local_9e0 = &local_198;
  ::std::
  bind<void(fineftp::FtpSession::*)(std::__cxx11::string_const&),fineftp::FtpSession*,std::_Placeholder<1>const&>
            (&local_1028,(offset_in_FtpSession_to_subr *)&local_1038,&local_1040,
             (_Placeholder<1> *)&::std::placeholders::_1);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_198,(char (*) [5])"OPTS",&local_1028);
  local_1068 = handleFtpCommandSIZE;
  local_1060 = 0;
  local_1070 = this;
  local_9e0 = &local_158;
  ::std::
  bind<void(fineftp::FtpSession::*)(std::__cxx11::string_const&),fineftp::FtpSession*,std::_Placeholder<1>const&>
            (&local_1058,(offset_in_FtpSession_to_subr *)&local_1068,&local_1070,
             (_Placeholder<1> *)&::std::placeholders::_1);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_158,(char (*) [5])"SIZE",&local_1058);
  local_118 = &local_9d8;
  local_110 = 0x23;
  this_00 = (allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>
             *)((long)&command_it._M_node + 6);
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>
  ::allocator(this_00);
  __l._M_len = local_110;
  __l._M_array = local_118;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>_>
         *)local_108,__l,
        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        ((long)&command_it._M_node + 7),this_00);
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>
  ::~allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>
                *)((long)&command_it._M_node + 6));
  local_1248 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
                *)&local_118;
  do {
    local_1248 = local_1248 + -1;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
    ::~pair(local_1248);
  } while (local_1248 != &local_9d8);
  local_1080._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>_>
               *)local_108,(key_type *)local_38);
  local_1088._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>_>
              *)local_108);
  bVar1 = std::operator!=(&local_1080,&local_1088);
  if (bVar1) {
    ppVar5 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>
             ::operator->(&local_1080);
    ::std::__cxx11::string::string(local_10a8,(string *)&space_index);
    std::
    function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
    ::operator()(&ppVar5->second,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_10a8);
    ::std::__cxx11::string::~string(local_10a8);
    ::std::__cxx11::string::operator=((string *)&this->last_command_,local_38);
  }
  else {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_10c8,"Unrecognized command",&local_10c9);
    sendFtpMessage(this,SYNTAX_ERROR_UNRECOGNIZED_COMMAND,(string *)local_10c8);
    ::std::__cxx11::string::~string(local_10c8);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_10c9);
  }
  bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &this->last_command_,"QUIT");
  if (bVar1) {
    std::enable_shared_from_this<fineftp::FtpSession>::shared_from_this(&local_1100);
    asio::io_context::strand::
    wrap<fineftp::FtpSession::handleFtpCommand(std::__cxx11::string_const&)::__1>
              (&local_10f0,&this->command_write_strand_,
               (anon_class_16_1_3fcf6656_for_handler_ *)&local_1100);
    asio::detail::
    wrapped_handler<asio::io_context::strand,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/continental[P]fineftp-server/fineftp-server/src/ftp_session.cpp:217:34),_asio::detail::is_continuation_if_running>
    ::~wrapped_handler(&local_10f0);
    handleFtpCommand(std::__cxx11::string_const&)::$_1::~__1((__1 *)&local_1100);
  }
  else {
    readFtpCommand(this);
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>_>
          *)local_108);
  ::std::__cxx11::string::~string((string *)&space_index);
  ::std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void FtpSession::handleFtpCommand(const std::string& command)
  {
    std::string ftp_command;
    std::string parameters;

    size_t space_index = command.find_first_of(' ');

    ftp_command = command.substr(0, space_index);
    std::transform(ftp_command.begin(), ftp_command.end(), ftp_command.begin(), [](char c) { return static_cast<char>(std::toupper(static_cast<unsigned char>(c))); });

    if (space_index != std::string::npos)
    {
      parameters = command.substr(space_index + 1, std::string::npos);
    }


    const std::map<std::string, std::function<void(std::string)>> command_map {
      // Access control commands
      { "USER", std::bind(&FtpSession::handleFtpCommandUSER, this, std::placeholders::_1) },
      { "PASS", std::bind(&FtpSession::handleFtpCommandPASS, this, std::placeholders::_1) },
      { "ACCT", std::bind(&FtpSession::handleFtpCommandACCT, this, std::placeholders::_1) },
      { "CWD",  std::bind(&FtpSession::handleFtpCommandCWD,  this, std::placeholders::_1) },
      { "CDUP", std::bind(&FtpSession::handleFtpCommandCDUP, this, std::placeholders::_1) },
      { "REIN", std::bind(&FtpSession::handleFtpCommandREIN, this, std::placeholders::_1) },
      { "QUIT", std::bind(&FtpSession::handleFtpCommandQUIT, this, std::placeholders::_1) },

      // Transfer parameter commands
      { "PORT", std::bind(&FtpSession::handleFtpCommandPORT, this, std::placeholders::_1) },
      { "PASV", std::bind(&FtpSession::handleFtpCommandPASV, this, std::placeholders::_1) },
      { "TYPE", std::bind(&FtpSession::handleFtpCommandTYPE, this, std::placeholders::_1) },
      { "STRU", std::bind(&FtpSession::handleFtpCommandSTRU, this, std::placeholders::_1) },
      { "MODE", std::bind(&FtpSession::handleFtpCommandMODE, this, std::placeholders::_1) },

      // Ftp service commands
      { "RETR", std::bind(&FtpSession::handleFtpCommandRETR, this, std::placeholders::_1) },
      { "STOR", std::bind(&FtpSession::handleFtpCommandSTOR, this, std::placeholders::_1) },
      { "STOU", std::bind(&FtpSession::handleFtpCommandSTOU, this, std::placeholders::_1) },
      { "APPE", std::bind(&FtpSession::handleFtpCommandAPPE, this, std::placeholders::_1) },
      { "ALLO", std::bind(&FtpSession::handleFtpCommandALLO, this, std::placeholders::_1) },
      { "REST", std::bind(&FtpSession::handleFtpCommandREST, this, std::placeholders::_1) },
      { "RNFR", std::bind(&FtpSession::handleFtpCommandRNFR, this, std::placeholders::_1) },
      { "RNTO", std::bind(&FtpSession::handleFtpCommandRNTO, this, std::placeholders::_1) },
      { "ABOR", std::bind(&FtpSession::handleFtpCommandABOR, this, std::placeholders::_1) },
      { "DELE", std::bind(&FtpSession::handleFtpCommandDELE, this, std::placeholders::_1) },
      { "RMD",  std::bind(&FtpSession::handleFtpCommandRMD,  this, std::placeholders::_1) },
      { "MKD",  std::bind(&FtpSession::handleFtpCommandMKD,  this, std::placeholders::_1) },
      { "PWD",  std::bind(&FtpSession::handleFtpCommandPWD,  this, std::placeholders::_1) },
      { "LIST", std::bind(&FtpSession::handleFtpCommandLIST, this, std::placeholders::_1) },
      { "NLST", std::bind(&FtpSession::handleFtpCommandNLST, this, std::placeholders::_1) },
      { "SITE", std::bind(&FtpSession::handleFtpCommandSITE, this, std::placeholders::_1) },
      { "SYST", std::bind(&FtpSession::handleFtpCommandSYST, this, std::placeholders::_1) },
      { "STAT", std::bind(&FtpSession::handleFtpCommandSTAT, this, std::placeholders::_1) },
      { "HELP", std::bind(&FtpSession::handleFtpCommandHELP, this, std::placeholders::_1) },
      { "NOOP", std::bind(&FtpSession::handleFtpCommandNOOP, this, std::placeholders::_1) },

      // Modern FTP Commands
      { "FEAT", std::bind(&FtpSession::handleFtpCommandFEAT, this, std::placeholders::_1) },
      { "OPTS", std::bind(&FtpSession::handleFtpCommandOPTS, this, std::placeholders::_1) },
      { "SIZE", std::bind(&FtpSession::handleFtpCommandSIZE, this, std::placeholders::_1) },
    };

    auto command_it = command_map.find(ftp_command);
    if (command_it != command_map.end())
    {
      command_it->second(parameters);
      last_command_ = ftp_command;
    }
    else
    {
      sendFtpMessage(FtpReplyCode::SYNTAX_ERROR_UNRECOGNIZED_COMMAND, "Unrecognized command");
    }

    if (last_command_ == "QUIT")
    {
      // Close command socket
      command_write_strand_.wrap([me = shared_from_this()]() { me->command_socket_.close();  });
    }
    else
    {
      // Wait for next command
      readFtpCommand();
    }
  }